

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

void __thiscall
glcts::ViewportArray::Utils::texture::get(texture *this,GLenum format,GLenum type,GLvoid *out_data)

{
  int iVar1;
  uint uVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *this_00;
  socklen_t __len;
  ulong uVar6;
  sockaddr *__addr;
  GLenum __fd;
  undefined4 uVar7;
  ulong uVar8;
  undefined4 local_50;
  GLuint temp_fbo;
  vector<int,_std::allocator<int>_> read_data;
  long lVar4;
  GLvoid *pGVar5;
  
  pGVar5 = out_data;
  __fd = format;
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  __len = (socklen_t)pGVar5;
  lVar4 = CONCAT44(extraout_var,iVar1);
  uVar2 = (*this->m_context->m_renderCtx->_vptr_RenderContext[2])();
  bind(this,__fd,__addr,__len);
  uVar7 = 0xde1;
  if (this->m_is_array != false) {
    uVar7 = 0x8c1a;
  }
  if ((uVar2 & 0x300) == 0x100) {
    (**(code **)(lVar4 + 0xaa0))(uVar7,0,format,type,out_data);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"GetTexImage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x32a);
    return;
  }
  temp_fbo = 0;
  (**(code **)(lVar4 + 0x6d0))(1,&temp_fbo);
  (**(code **)(lVar4 + 0x78))(0x8ca8,temp_fbo);
  local_50 = 0x1908;
  if (format != 0x1903) {
    if (format != 0x8d94) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"unexpected format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                 ,0x342);
      goto LAB_00d880ab;
    }
    local_50 = 0x8d99;
  }
  if ((type & 0xfffffffd) == 0x1404) {
    read_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    read_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    read_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    iVar1 = this->m_height * this->m_width;
    std::vector<int,_std::allocator<int>_>::resize(&read_data,(ulong)(this->m_depth * iVar1 * 4));
    if (this->m_is_array == true) {
      uVar6 = 0;
      for (uVar8 = 0; uVar8 < this->m_depth; uVar8 = uVar8 + 1) {
        (**(code **)(lVar4 + 0x6b8))(0x8ca8,0x8ce0,this->m_id,0,uVar8 & 0xffffffff);
        (**(code **)(lVar4 + 0x1220))
                  (0,0,this->m_width,this->m_height,local_50,type,
                   read_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar6);
        uVar6 = (ulong)(uint)((int)uVar6 + iVar1 * 4);
      }
    }
    else {
      (**(code **)(lVar4 + 0x6a0))(0x8ca8,0x8ce0,uVar7,this->m_id,0);
      (**(code **)(lVar4 + 0x1220))
                (0,0,this->m_width,this->m_height,local_50,type,
                 read_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"ReadPixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x35a);
    (**(code **)(lVar4 + 0x440))(1,&temp_fbo);
    uVar6 = 0;
    for (uVar8 = 0; uVar8 < this->m_height * this->m_width * this->m_depth; uVar8 = uVar8 + 1) {
      *(int *)((long)out_data + uVar6) =
           read_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar6 & 0xffffffff];
      uVar6 = uVar6 + 4;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&read_data.super__Vector_base<int,_std::allocator<int>_>);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"unexpected type",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
             ,0x347);
LAB_00d880ab:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Utils::texture::get(glw::GLenum format, glw::GLenum type, glw::GLvoid* out_data) const
{
	const glw::Functions&   gl			 = m_context.getRenderContext().getFunctions();
	const glu::ContextType& context_type = m_context.getRenderContext().getType();

	bind();

	GLenum textarget = GL_TEXTURE_2D;

	if (true == m_is_array)
	{
		textarget = GL_TEXTURE_2D_ARRAY;
	}

	if (glu::isContextTypeGLCore(context_type))
	{
		gl.getTexImage(textarget, 0 /* level */, format, type, out_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexImage");
	}
	else
	{
		DE_ASSERT(glu::isContextTypeES(context_type));

		GLuint temp_fbo = 0;
		gl.genFramebuffers(1, &temp_fbo);
		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, temp_fbo);

		/* OpenGL ES only guarantees support for RGBA formats of each type.
		Since the tests are only expecting single-channel formats, we read them back
		in RGBA to a temporary buffer and then copy only the first component
		to the actual output buffer */
		GLenum read_format = format;
		switch (format)
		{
		case GL_RED:
			read_format = GL_RGBA;
			break;
		case GL_RED_INTEGER:
			read_format = GL_RGBA_INTEGER;
			break;
		default:
			TCU_FAIL("unexpected format");
		}
		/* we can get away just handling one type of data, as long as the components are the same size */
		if (type != GL_INT && type != GL_FLOAT)
		{
			TCU_FAIL("unexpected type");
		}
		std::vector<GLint> read_data;
		const GLuint	   layer_size = m_width * m_height * 4;
		read_data.resize(layer_size * m_depth);

		if (m_is_array)
		{
			for (GLuint layer = 0; layer < m_depth; ++layer)
			{
				gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_id, 0, layer);
				gl.readPixels(0, 0, m_width, m_height, read_format, type, &read_data[layer * layer_size]);
			}
		}
		else
		{
			gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, textarget, m_id, 0);
			gl.readPixels(0, 0, m_width, m_height, read_format, type, &read_data[0]);
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "ReadPixels");
		gl.deleteFramebuffers(1, &temp_fbo);

		/* copy the first channel from the readback buffer to the output buffer */
		GLint* out_data_int = (GLint*)out_data;
		for (GLuint elem = 0; elem < (m_width * m_height * m_depth); ++elem)
		{
			out_data_int[elem] = read_data[elem * 4];
		}
	}
}